

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O1

void __thiscall
cmMakefileTargetGenerator::WriteObjectsStrings
          (cmMakefileTargetGenerator *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *objStrings,bool useWatcomQuote,size_type limit)

{
  cmMakefile *this_00;
  cmLocalUnixMakefileGenerator3 *this_01;
  pointer pbVar1;
  cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *__n1;
  cmGeneratorTarget *this_02;
  int iVar2;
  cmValue cVar3;
  string *obj_1;
  cmState *obj_00;
  string *obj;
  pointer pbVar4;
  basic_string_view<char,_std::char_traits<char>_> __str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ispcAdditionalObjs;
  cmMakefileTargetGeneratorObjectStrings helper;
  cmStateSnapshot local_100;
  undefined1 local_e8 [16];
  undefined1 local_d8 [24];
  undefined1 local_c0 [32];
  pointer pcStack_a0;
  cmState *local_98;
  cmLinkedTree<cmStateDetail::SnapshotDataType> *pcStack_90;
  pointer local_88;
  size_type local_80;
  value_type local_78;
  _Alloc_hider local_58;
  size_type local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  char *local_38;
  
  this_00 = (this->super_cmCommonTargetGenerator).Makefile;
  local_c0._0_8_ = local_c0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"CMAKE_PCH_EXTENSION","");
  cVar3 = cmMakefile::GetDefinition(this_00,(string *)local_c0);
  if ((undefined1 *)local_c0._0_8_ != local_c0 + 0x10) {
    operator_delete((void *)local_c0._0_8_,CONCAT71(local_c0._17_7_,local_c0[0x10]) + 1);
  }
  this_01 = this->LocalGenerator;
  cmLocalGenerator::GetStateSnapshot(&local_100,(cmLocalGenerator *)this_01);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)local_e8,&local_100);
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  local_c0._24_8_ = local_e8._0_8_;
  pcStack_a0 = (pointer)local_e8._8_8_;
  local_98 = (cmState *)local_d8._0_8_;
  pcStack_90 = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)local_d8._8_8_;
  local_88 = (pointer)local_d8._16_8_;
  local_78._M_string_length = 0;
  local_78.field_2._M_local_buf[0] = '\0';
  local_58._M_p = (pointer)&local_48;
  local_50 = 0;
  local_48._M_local_buf[0] = '\0';
  local_38 = "";
  pbVar4 = (this->Objects).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (this->Objects).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_c0._0_8_ = objStrings;
  local_c0._8_8_ = this_01;
  local_c0[0x10] = useWatcomQuote;
  local_80 = limit;
  if (pbVar4 != pbVar1) {
    do {
      local_e8._8_8_ = (pbVar4->_M_dataplus)._M_p;
      local_e8._0_8_ = pbVar4->_M_string_length;
      if (cVar3.Value == (string *)0x0) {
LAB_005ffa92:
        cmMakefileTargetGeneratorObjectStrings::Feed
                  ((cmMakefileTargetGeneratorObjectStrings *)local_c0,pbVar4);
      }
      else {
        __n1 = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)
               (cVar3.Value)->_M_string_length;
        if ((ulong)local_e8._0_8_ < __n1) goto LAB_005ffa92;
        __str._M_str = ((cVar3.Value)->_M_dataplus)._M_p;
        __str._M_len = (size_t)__n1;
        iVar2 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                          ((basic_string_view<char,_std::char_traits<char>_> *)local_e8,
                           local_e8._0_8_ - (long)__n1,(size_type)__n1,__str);
        if (iVar2 != 0) goto LAB_005ffa92;
      }
      pbVar4 = pbVar4 + 1;
    } while (pbVar4 != pbVar1);
  }
  pbVar4 = (this->ExternalObjects).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (this->ExternalObjects).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar4 != pbVar1) {
    do {
      cmMakefileTargetGeneratorObjectStrings::Feed
                ((cmMakefileTargetGeneratorObjectStrings *)local_c0,pbVar4);
      pbVar4 = pbVar4 + 1;
    } while (pbVar4 != pbVar1);
  }
  this_02 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  GetConfigName_abi_cxx11_((string *)local_e8,this);
  cmGeneratorTarget::GetGeneratedISPCObjects
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_100,this_02,(string *)local_e8);
  if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_e8._0_8_ !=
      (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_d8) {
    operator_delete((void *)local_e8._0_8_,(ulong)(local_d8._0_8_ + 1));
  }
  if (local_100.State != (cmState *)local_100.Position.Tree) {
    obj_00 = local_100.State;
    do {
      cmMakefileTargetGeneratorObjectStrings::Feed
                ((cmMakefileTargetGeneratorObjectStrings *)local_c0,(string *)obj_00);
      obj_00 = (cmState *)
               &(obj_00->PropertyDefinitions).Map_._M_t._M_impl.super__Rb_tree_header._M_header.
                _M_right;
    } while (obj_00 != (cmState *)local_100.Position.Tree);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_c0._0_8_,&local_78);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_p != &local_48) {
    operator_delete(local_58._M_p,
                    CONCAT71(local_48._M_allocated_capacity._1_7_,local_48._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                             local_78.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void cmMakefileTargetGenerator::WriteObjectsStrings(
  std::vector<std::string>& objStrings, bool useWatcomQuote,
  std::string::size_type limit)
{
  cmValue pchExtension = this->Makefile->GetDefinition("CMAKE_PCH_EXTENSION");

  cmMakefileTargetGeneratorObjectStrings helper(
    objStrings, this->LocalGenerator, useWatcomQuote,
    this->LocalGenerator->GetStateSnapshot().GetDirectory(), limit);
  for (std::string const& obj : this->Objects) {
    if (cmHasSuffix(obj, pchExtension)) {
      continue;
    }
    helper.Feed(obj);
  }
  for (std::string const& obj : this->ExternalObjects) {
    helper.Feed(obj);
  }
  auto const ispcAdditionalObjs =
    this->GeneratorTarget->GetGeneratedISPCObjects(this->GetConfigName());
  for (std::string const& obj : ispcAdditionalObjs) {
    helper.Feed(obj);
  }
  helper.Done();
}